

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a4_aux.c
# Opt level: O0

void polygon(int vertices,int *points,ALLEGRO_COLOR color)

{
  int *in_RSI;
  int in_EDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  int i;
  ALLEGRO_VERTEX vtxs [8];
  int local_14c;
  float local_148 [5];
  undefined8 local_134 [2];
  undefined1 local_124 [260];
  int *local_20;
  int local_14;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_8 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_148[0] = 0.0;
  local_148[1] = 0.0;
  local_148[2] = 0.0;
  local_148[3] = 0.0;
  local_148[4] = 0.0;
  for (local_14c = 0; local_14c < in_EDI; local_14c = local_14c + 1) {
    local_148[0] = (float)in_RSI[local_14c << 1] + local_148[0];
    local_148[1] = (float)in_RSI[local_14c * 2 + 1] + local_148[1];
  }
  local_148[0] = local_148[0] / (float)in_EDI;
  local_148[1] = local_148[1] / (float)in_EDI;
  local_20 = in_RSI;
  local_14 = in_EDI;
  for (local_14c = 1; local_14c <= local_14; local_14c = local_14c + 1) {
    local_148[(long)local_14c * 9] = (float)*local_20;
    local_148[(long)local_14c * 9 + 1] = (float)local_20[1];
    local_148[(long)local_14c * 9 + 2] = 0.0;
    *(undefined8 *)((long)local_134 + (long)local_14c * 0x24) = local_10;
    *(undefined8 *)((long)local_134 + (long)local_14c * 0x24 + 8) = local_8;
    *(undefined4 *)((long)local_134 + (long)local_14c * 0x24 + -8) = 0;
    *(undefined4 *)((long)local_134 + (long)local_14c * 0x24 + -4) = 0;
    local_20 = local_20 + 2;
  }
  memcpy(local_148 + (long)(local_14 + 1) * 9,local_124,0x24);
  al_draw_prim(local_148,0,0,0,local_14 + 2,5);
  return;
}

Assistant:

void polygon(int vertices, const int *points, ALLEGRO_COLOR color)
{
   ALLEGRO_VERTEX vtxs[MAX_POLYGON_VERTICES + 2];
   int i;

   assert(vertices <= MAX_POLYGON_VERTICES);

   vtxs[0].x = 0.0;
   vtxs[0].y = 0.0;
   vtxs[0].z = 0.0;
   vtxs[0].color = color;
   vtxs[0].u = 0;
   vtxs[0].v = 0;

   for (i = 0; i < vertices; i++) {
      vtxs[0].x += points[i*2];
      vtxs[0].y += points[i*2 + 1];
   }

   vtxs[0].x /= vertices;
   vtxs[0].y /= vertices;

   for (i = 1; i <= vertices; i++) {
      vtxs[i].x = points[0];
      vtxs[i].y = points[1];
      vtxs[i].z = 0.0;
      vtxs[i].color = color;
      vtxs[i].u = 0;
      vtxs[i].v = 0;
      points += 2;
   }

   vtxs[vertices + 1] = vtxs[1];

   al_draw_prim(vtxs, NULL, NULL, 0, vertices + 2, ALLEGRO_PRIM_TRIANGLE_FAN);
}